

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::usda::USDAReader::Impl::ReconstructPrim<tinyusdz::Scope>
          (Impl *this,Specifier *spec,PropertyMap *properties,ReferenceList *references,Scope *prim)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *warn;
  string local_260;
  string local_240;
  allocator local_219;
  string local_218 [32];
  string local_1f8;
  ostringstream local_1d8 [8];
  ostringstream ss_e;
  undefined1 local_60 [8];
  string err;
  PrimReconstructOptions options;
  Scope *prim_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  Impl *this_local;
  
  tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions
            ((PrimReconstructOptions *)(err.field_2._M_local_buf + 0xf));
  err.field_2._M_local_buf[0xf] = (this->_config).strict_allowedToken_check & 1;
  ::std::__cxx11::string::string((string *)local_60);
  warn = &this->_warn;
  bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::Scope>
                    (spec,properties,references,prim,warn,(string *)local_60,
                     (PrimReconstructOptions *)(err.field_2._M_local_buf + 0xf));
  if (!bVar1) {
    ::std::__cxx11::ostringstream::ostringstream(local_1d8);
    poVar2 = ::std::operator<<((ostream *)local_1d8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReconstructPrim");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x657);
    ::std::operator<<(poVar2," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_218,"Failed to reconstruct {} Prim: {}",&local_219);
    tinyusdz::value::TypeTraits<tinyusdz::Scope>::type_name_abi_cxx11_();
    fmt::format<std::__cxx11::string,std::__cxx11::string>
              (&local_1f8,(fmt *)local_218,&local_240,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,warn);
    poVar2 = ::std::operator<<((ostream *)local_1d8,(string *)&local_1f8);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)&local_1f8);
    ::std::__cxx11::string::~string((string *)&local_240);
    ::std::__cxx11::string::~string(local_218);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_219);
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_260);
    ::std::__cxx11::string::~string((string *)&local_260);
    ::std::__cxx11::ostringstream::~ostringstream(local_1d8);
  }
  ::std::__cxx11::string::~string((string *)local_60);
  return bVar1;
}

Assistant:

bool USDAReader::Impl::ReconstructPrim(
    const Specifier &spec,
    const prim::PropertyMap &properties,
    const prim::ReferenceList &references,
    T *prim) {

  prim::PrimReconstructOptions options;
  options.strict_allowedToken_check = _config.strict_allowedToken_check;
  DCOUT("strict_allowedToken_check " << options.strict_allowedToken_check);

  std::string err;
  if (!prim::ReconstructPrim(spec, properties, references, prim, &_warn, &err, options)) {
    PUSH_ERROR_AND_RETURN(fmt::format("Failed to reconstruct {} Prim: {}", value::TypeTraits<T>::type_name(), err));
  }
  return true;
}